

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin2cpp.cpp
# Opt level: O1

string * convertFilename(string *__return_storage_ptr__,string *input)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  string text;
  string fpath;
  undefined1 *local_90;
  ulong local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  pcVar1 = (input->_M_dataplus)._M_p;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + input->_M_string_length);
  lVar4 = std::__cxx11::string::rfind((char *)local_70,0x104004,0xffffffffffffffff);
  local_88 = 0;
  local_80 = 0;
  local_90 = &local_80;
  if (lVar4 == -1) {
    std::__cxx11::string::_M_assign((string *)&local_90);
  }
  else {
    std::__cxx11::string::substr((ulong)local_50,(ulong)local_70);
    std::__cxx11::string::operator=((string *)&local_90,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (local_88 != 0) {
    uVar5 = 0;
    uVar7 = 1;
    do {
      iVar6 = (int)(char)local_90[uVar5];
      if ((iVar6 == 0x2e) || ((__return_storage_ptr__->_M_dataplus)._M_p[uVar5] == ' ')) {
LAB_0010247a:
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        iVar3 = isalpha(iVar6);
        if (iVar6 - 0x30U < 10 || iVar3 != 0) goto LAB_0010247a;
      }
      bVar2 = uVar7 < local_88;
      uVar5 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar2);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string convertFilename(const std::string &input) {
    std::string fpath=input;
    ssize_t pos = fpath.rfind("/");
    std::string text;
    if(pos != std::string::npos)
        text = fpath.substr(pos+1, fpath.length()-pos);
    else
        text = input;
    
    std::string temp;
    for(unsigned int i = 0; i < text.length(); ++i) {
        if(text[i] == '.' || temp[i] == ' ')
            temp += '_';
        else if(isalpha(text[i]) || isdigit(text[i]))
            temp += text[i];
    }
    return temp;
}